

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iaf_psc_alpha.cpp
# Opt level: O0

void __thiscall iaf_psc_alpha::handleEvent(iaf_psc_alpha *this,Event *e)

{
  double dVar1;
  double weighted;
  Event *e_local;
  iaf_psc_alpha *this_local;
  
  if (e->type == Spike) {
    dVar1 = *(double *)&e[1].type * (double)*(int *)&e[1]._vptr_Event;
    if (dVar1 <= 0.0) {
      this->in_spikes_ = dVar1 + this->in_spikes_;
    }
    else {
      this->ex_spikes_ = dVar1 + this->ex_spikes_;
    }
  }
  else if (e->type == Current) {
    this->y0_ = *(double *)&e[1].type * (double)e[1]._vptr_Event + this->y0_;
  }
  return;
}

Assistant:

void iaf_psc_alpha::handleEvent(Event* e) {
    if(e->type == EventType::Spike) {
        double weighted = static_cast<SpikeEvent*>(e)->weight * static_cast<SpikeEvent*>(e)->multiplicity;
        if(weighted > 0.0) {
            ex_spikes_ += weighted;
        }
        else {
            in_spikes_ += weighted;
        }
    }
    else if(e->type == EventType::Current) {
        y0_ += static_cast<CurrentEvent*>(e)->weight * static_cast<CurrentEvent*>(e)->current;
    }
}